

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf::clear(xr_ogf *this)

{
  pointer puVar1;
  
  xr_object::clear(&this->super_xr_object);
  this->m_loaded = 0;
  (this->m_path)._M_string_length = 0;
  *(this->m_path)._M_dataplus._M_p = '\0';
  (this->m_texture)._M_string_length = 0;
  *(undefined8 *)&(this->m_bbox).field_0 = 0;
  *(undefined8 *)((long)&(this->m_bbox).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->m_bbox).field_0 + 0x10) = 0;
  *(undefined8 *)&(this->m_bsphere).p.field_0 = 0;
  *(undefined8 *)((long)&(this->m_bsphere).p.field_0 + 8) = 0;
  *(this->m_texture)._M_dataplus._M_p = '\0';
  (this->m_shader)._M_string_length = 0;
  *(this->m_shader)._M_dataplus._M_p = '\0';
  xr_vbuf::clear(&this->m_vb);
  xr_ibuf::clear(&this->m_ib);
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_children);
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_lods);
  puVar1 = (this->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void xr_ogf::clear()
{
	xr_object::clear();
	m_loaded = 0;
	m_path.clear();
	m_bbox.null();
	m_bsphere.reset();
	m_texture.clear();
	m_shader.clear();
	m_vb.clear();
	m_ib.clear();
	trim_container(m_children);
	trim_container(m_lods);
	m_children_l.clear();
}